

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O1

void __thiscall Mempool::print_list_content(Mempool *this,MEM_CAP index)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  mapped_type *ppCVar4;
  ulong uVar5;
  uint uVar6;
  MEM_CAP MVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  mapped_type this_00;
  MEM_CAP local_2c;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mp_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  MVar7 = index + 0x3ff;
  if (-1 < (int)index) {
    MVar7 = index;
  }
  printf("***************start to print %dkb chunk_size list data*******************\n",
         (ulong)(uint)((int)MVar7 >> 10));
  uVar1 = (this->mp_pool)._M_h._M_bucket_count;
  uVar5 = (ulong)(long)(int)index % uVar1;
  p_Var8 = (this->mp_pool)._M_h._M_buckets[uVar5];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(MEM_CAP *)&p_Var8->_M_nxt[1]._M_nxt != index)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)(long)(int)*(MEM_CAP *)&p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var9 = p_Var8, *(MEM_CAP *)&p_Var2[1]._M_nxt == index)) goto LAB_00106524;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00106524:
  if ((p_Var9 != (__node_base_ptr)0x0) && (p_Var9->_M_nxt != (_Hash_node_base *)0x0)) {
    local_2c = index;
    ppCVar4 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_2c);
    uVar6 = 0;
    for (this_00 = *ppCVar4; this_00 != (Chunk *)0x0; this_00 = this_00->next) {
      if (uVar6 < 6) {
        Chunk::print_data(this_00);
      }
      uVar6 = uVar6 + 1;
    }
    puts("...");
    printf("******************end, node cnt is %d************************\n\n",(ulong)uVar6);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return;
  }
  __assert_fail("mp_pool.find(index) != mp_pool.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                ,0x73,"void Mempool::print_list_content(MEM_CAP)");
}

Assistant:

void Mempool::print_list_content(MEM_CAP index)
{
    lock_guard<mutex> lck(mp_mutex);
    int cnt = 0;
    printf("***************start to print %dkb chunk_size list data*******************\n", index/1024);
    assert(mp_pool.find(index) != mp_pool.end());
    Chunk *node = mp_pool[index];

    while (node)
    {
        if(cnt <= 5)
            node->print_data();
        cnt++;
        node = node->next;
    }
    printf("...\n");
    printf("******************end, node cnt is %d************************\n\n", cnt);
}